

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_check_zero_element(TCGContext_conflict6 *tcg_ctx,TCGv_i64 tresult,uint8_t df,uint8_t wt)

{
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 t1;
  TCGv_i64 t0;
  uint64_t eval_big;
  uint64_t eval_zero_or_big;
  uint8_t wt_local;
  uint8_t df_local;
  TCGv_i64 tresult_local;
  TCGContext_conflict6 *tcg_ctx_local;
  
  eval_big = 0;
  t0 = (TCGv_i64)0x0;
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  switch(df) {
  case '\0':
    eval_big = 0x101010101010101;
    t0 = (TCGv_i64)0x8080808080808080;
    break;
  case '\x01':
    eval_big = 0x1000100010001;
    t0 = (TCGv_i64)0x8000800080008000;
    break;
  case '\x02':
    eval_big = 0x100000001;
    t0 = (TCGv_i64)0x8000000080000000;
    break;
  case '\x03':
    eval_big = 1;
    t0 = (TCGv_i64)0x8000000000000000;
  }
  tcg_gen_subi_i64_mips64el(tcg_ctx,ret,tcg_ctx->msa_wr_d[(int)((uint)wt << 1)],eval_big);
  tcg_gen_andc_i64_mips64el(tcg_ctx,ret,ret,tcg_ctx->msa_wr_d[(int)((uint)wt << 1)]);
  tcg_gen_andi_i64_mips64el(tcg_ctx,ret,ret,(int64_t)t0);
  tcg_gen_subi_i64_mips64el(tcg_ctx,ret_00,tcg_ctx->msa_wr_d[(int)((uint)wt * 2 + 1)],eval_big);
  tcg_gen_andc_i64_mips64el(tcg_ctx,ret_00,ret_00,tcg_ctx->msa_wr_d[(int)((uint)wt * 2 + 1)]);
  tcg_gen_andi_i64_mips64el(tcg_ctx,ret_00,ret_00,(int64_t)t0);
  tcg_gen_or_i64_mips64el(tcg_ctx,ret,ret,ret_00);
  tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,ret,ret,0);
  tcg_gen_mov_i64_mips64el(tcg_ctx,tresult,ret);
  tcg_temp_free_i64(tcg_ctx,ret);
  tcg_temp_free_i64(tcg_ctx,ret_00);
  return;
}

Assistant:

static void gen_check_zero_element(TCGContext *tcg_ctx, TCGv tresult, uint8_t df, uint8_t wt)
{
    /* generates tcg ops to check if any element is 0 */
    /* Note this function only works with MSA_WRLEN = 128 */
    uint64_t eval_zero_or_big = 0;
    uint64_t eval_big = 0;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    switch (df) {
    case DF_BYTE:
        eval_zero_or_big = 0x0101010101010101ULL;
        eval_big = 0x8080808080808080ULL;
        break;
    case DF_HALF:
        eval_zero_or_big = 0x0001000100010001ULL;
        eval_big = 0x8000800080008000ULL;
        break;
    case DF_WORD:
        eval_zero_or_big = 0x0000000100000001ULL;
        eval_big = 0x8000000080000000ULL;
        break;
    case DF_DOUBLE:
        eval_zero_or_big = 0x0000000000000001ULL;
        eval_big = 0x8000000000000000ULL;
        break;
    }
    tcg_gen_subi_i64(tcg_ctx, t0, tcg_ctx->msa_wr_d[wt << 1], eval_zero_or_big);
    tcg_gen_andc_i64(tcg_ctx, t0, t0, tcg_ctx->msa_wr_d[wt << 1]);
    tcg_gen_andi_i64(tcg_ctx, t0, t0, eval_big);
    tcg_gen_subi_i64(tcg_ctx, t1, tcg_ctx->msa_wr_d[(wt << 1) + 1], eval_zero_or_big);
    tcg_gen_andc_i64(tcg_ctx, t1, t1, tcg_ctx->msa_wr_d[(wt << 1) + 1]);
    tcg_gen_andi_i64(tcg_ctx, t1, t1, eval_big);
    tcg_gen_or_i64(tcg_ctx, t0, t0, t1);
    /* if all bits are zero then all elements are not zero */
    /* if some bit is non-zero then some element is zero */
    tcg_gen_setcondi_i64(tcg_ctx, TCG_COND_NE, t0, t0, 0);
    tcg_gen_trunc_i64_tl(tcg_ctx, tresult, t0);
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}